

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_bKGD(png_structrp png_ptr,png_const_color_16p back,int color_type)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined8 in_RAX;
  size_t length;
  char *warning_message;
  png_byte buf [6];
  undefined8 uStack_8;
  
  uStack_8._0_2_ = (undefined2)in_RAX;
  uStack_8 = in_RAX;
  if (color_type == 3) {
    if (((png_ptr->num_palette != 0) || ((png_ptr->mng_features_permitted & 1) == 0)) &&
       (png_ptr->num_palette <= (ushort)back->index)) {
      warning_message = "Invalid background palette index";
      goto LAB_00122711;
    }
    uStack_8._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
    uStack_8._0_3_ = CONCAT12(back->index,(undefined2)uStack_8);
    length = 1;
  }
  else if ((color_type & 2U) == 0) {
    uVar1 = back->gray;
    if (1 << (png_ptr->bit_depth & 0x1f) <= (int)(uint)uVar1) {
      warning_message = "Ignoring attempt to write bKGD chunk out-of-range for bit_depth";
LAB_00122711:
      png_warning(png_ptr,warning_message);
      return;
    }
    uStack_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    uStack_8._0_4_ = CONCAT22(uVar1 << 8 | uVar1 >> 8,(undefined2)uStack_8);
    length = 2;
  }
  else {
    uVar1 = back->red;
    uStack_8._0_4_ = CONCAT22(uVar1 << 8 | uVar1 >> 8,(undefined2)uStack_8);
    uVar2 = back->green;
    uVar3 = back->blue;
    uStack_8 = CONCAT26(uVar3 << 8 | uVar3 >> 8,
                        CONCAT24(uVar2 << 8 | uVar2 >> 8,(undefined4)uStack_8));
    if ((png_ptr->bit_depth == '\b') &&
       (((char)(uVar2 >> 8) != '\0' || (char)(uVar1 >> 8) != '\0') || (char)(uVar3 >> 8) != '\0')) {
      warning_message = "Ignoring attempt to write 16-bit bKGD chunk when bit_depth is 8";
      goto LAB_00122711;
    }
    length = 6;
  }
  png_write_complete_chunk(png_ptr,0x624b4744,(png_const_bytep)((long)&uStack_8 + 2),length);
  return;
}

Assistant:

void /* PRIVATE */
png_write_bKGD(png_structrp png_ptr, png_const_color_16p back, int color_type)
{
   png_byte buf[6];

   png_debug(1, "in png_write_bKGD");

   if (color_type == PNG_COLOR_TYPE_PALETTE)
   {
      if (
#ifdef PNG_MNG_FEATURES_SUPPORTED
          (png_ptr->num_palette != 0 ||
          (png_ptr->mng_features_permitted & PNG_FLAG_MNG_EMPTY_PLTE) == 0) &&
#endif
         back->index >= png_ptr->num_palette)
      {
         png_warning(png_ptr, "Invalid background palette index");
         return;
      }

      buf[0] = back->index;
      png_write_complete_chunk(png_ptr, png_bKGD, buf, 1);
   }

   else if ((color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_save_uint_16(buf, back->red);
      png_save_uint_16(buf + 2, back->green);
      png_save_uint_16(buf + 4, back->blue);
#ifdef PNG_WRITE_16BIT_SUPPORTED
      if (png_ptr->bit_depth == 8 && (buf[0] | buf[2] | buf[4]) != 0)
#else
      if ((buf[0] | buf[2] | buf[4]) != 0)
#endif
      {
         png_warning(png_ptr,
             "Ignoring attempt to write 16-bit bKGD chunk "
             "when bit_depth is 8");

         return;
      }

      png_write_complete_chunk(png_ptr, png_bKGD, buf, 6);
   }

   else
   {
      if (back->gray >= (1 << png_ptr->bit_depth))
      {
         png_warning(png_ptr,
             "Ignoring attempt to write bKGD chunk out-of-range for bit_depth");

         return;
      }

      png_save_uint_16(buf, back->gray);
      png_write_complete_chunk(png_ptr, png_bKGD, buf, 2);
   }
}